

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void map_delete_record(JSRuntime *rt,JSMapState *s,JSMapRecord *mr)

{
  int *piVar1;
  int iVar2;
  list_head *plVar3;
  list_head *plVar4;
  JSMapRecord *pJVar5;
  JSValue JVar6;
  JSMapRecord **ppJVar7;
  JSMapRecord **ppJVar8;
  
  if (mr->empty != 0) {
    return;
  }
  plVar3 = (mr->hash_link).prev;
  plVar4 = (mr->hash_link).next;
  plVar3->next = plVar4;
  plVar4->prev = plVar3;
  (mr->hash_link).prev = (list_head *)0x0;
  (mr->hash_link).next = (list_head *)0x0;
  if (s->is_weak == 0) {
    piVar1 = (int *)(mr->key).u.ptr;
    JVar6 = mr->key;
    if ((0xfffffff4 < (uint)(mr->key).tag) && (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(rt,JVar6);
    }
  }
  else {
    ppJVar7 = (JSMapRecord **)((long)(mr->key).u.ptr + 0x28);
    do {
      ppJVar8 = ppJVar7;
      pJVar5 = *ppJVar8;
      ppJVar7 = &pJVar5->next_weak_ref;
    } while (pJVar5 != mr);
    *ppJVar8 = *ppJVar7;
  }
  piVar1 = (int *)(mr->value).u.ptr;
  JVar6 = mr->value;
  if ((0xfffffff4 < (uint)(mr->value).tag) && (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,JVar6);
  }
  mr->ref_count = mr->ref_count + -1;
  if (mr->ref_count == 0) {
    plVar3 = (mr->link).prev;
    plVar4 = (mr->link).next;
    plVar3->next = plVar4;
    plVar4->prev = plVar3;
    (mr->link).prev = (list_head *)0x0;
    (mr->link).next = (list_head *)0x0;
    (*(rt->mf).js_free)(&rt->malloc_state,mr);
  }
  else {
    mr->empty = 1;
    (mr->key).u.int32 = 0;
    (mr->key).tag = 3;
    (mr->value).u.int32 = 0;
    (mr->value).tag = 3;
  }
  s->record_count = s->record_count - 1;
  return;
}

Assistant:

static void map_delete_record(JSRuntime *rt, JSMapState *s, JSMapRecord *mr)
{
    if (mr->empty)
        return;
    list_del(&mr->hash_link);
    if (s->is_weak) {
        delete_weak_ref(rt, mr);
    } else {
        JS_FreeValueRT(rt, mr->key);
    }
    JS_FreeValueRT(rt, mr->value);
    if (--mr->ref_count == 0) {
        list_del(&mr->link);
        js_free_rt(rt, mr);
    } else {
        /* keep a zombie record for iterators */
        mr->empty = TRUE;
        mr->key = JS_UNDEFINED;
        mr->value = JS_UNDEFINED;
    }
    s->record_count--;
}